

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Material.h
# Opt level: O1

void __thiscall FBX::Material::Material(Material *this,Node *node)

{
  string *psVar1;
  pointer pcVar2;
  size_t __n;
  double dVar3;
  string *psVar4;
  Material *pMVar5;
  Node *node_00;
  int iVar6;
  variant_alternative_t<5UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar7;
  variant_alternative_t<6UL,_variant<short,_bool,_int,_float,_double,_long,_basic_string<char>,_vector<float,_allocator<float>_>,_vector<int,_allocator<int>_>,_vector<double,_allocator<double>_>,_vector<long,_allocator<long>_>,_vector<bool,_allocator<bool>_>,_vector<char,_allocator<char>_>_>_>
  *pvVar8;
  Node *prop;
  pointer pNVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Vector3 VVar13;
  Node properties;
  undefined1 local_118 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  long local_f8 [2];
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_e8;
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  local_d0;
  Material *local_b8;
  string local_b0;
  Node *local_90;
  long *local_88;
  long local_80;
  long local_78 [2];
  long *local_68;
  size_t local_60;
  long local_58 [2];
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_48;
  
  pvVar7 = std::
           get<5ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                     ((node->properties).
                      super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
  (this->super_Object).id = *pvVar7;
  (this->texture).super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->texture).super___shared_ptr<FBX::Texture,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_68 = local_58;
  local_b8 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"ShadingModel","");
  local_88 = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"phong","");
  local_b0.field_2._M_allocated_capacity = 0x69747265706f7250;
  local_b0.field_2._8_4_ = 0x30377365;
  local_b0._M_string_length = 0xc;
  local_b0.field_2._M_local_buf[0xc] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  findNodes(&local_48,node,&local_b0);
  local_118._0_8_ =
       (local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
        super__Vector_impl_data._M_start)->propertyCount;
  local_118._8_4_ =
       (undefined4)
       (local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
        super__Vector_impl_data._M_start)->propertyLength;
  local_118._12_4_ =
       *(undefined4 *)
        ((long)&(local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                 super__Vector_impl_data._M_start)->propertyLength + 4);
  local_108._M_allocated_capacity = (size_type)local_f8;
  pcVar2 = ((local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start)->id)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_118 + 0x10),pcVar2,
             pcVar2 + ((local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                        super__Vector_impl_data._M_start)->id)._M_string_length);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::vector
            (&local_e8,
             &(local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
               super__Vector_impl_data._M_start)->children);
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::vector(&local_d0,
           &(local_48.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start)->properties);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  psVar1 = &this->shadingModel;
  local_90 = node;
  if (local_e8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_e8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    psVar4 = &local_b8->shadingModel;
    pNVar9 = local_e8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
             super__Vector_impl_data._M_start;
    do {
      pvVar8 = std::
               get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         ((pNVar9->properties).
                          super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
      __n = pvVar8->_M_string_length;
      if (__n == local_60) {
        if (__n == 0) {
          bVar10 = true;
        }
        else {
          iVar6 = bcmp((pvVar8->_M_dataplus)._M_p,local_68,__n);
          bVar10 = iVar6 == 0;
        }
      }
      else {
        bVar10 = false;
      }
      if (bVar10) {
        pvVar8 = std::
                 get<6ul,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                           ((pNVar9->properties).
                            super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + 4);
        (psVar1->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
        pcVar2 = (pvVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)psVar1,pcVar2,pcVar2 + pvVar8->_M_string_length);
        if (bVar10) goto LAB_0010ae81;
      }
      pNVar9 = pNVar9 + 1;
    } while (pNVar9 != local_e8.super__Vector_base<FBX::Node,_std::allocator<FBX::Node>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  (local_b8->shadingModel)._M_dataplus._M_p = (pointer)&(local_b8->shadingModel).field_2;
  std::__cxx11::string::_M_construct<char*>((string *)psVar1,local_88,local_80 + (long)local_88);
LAB_0010ae81:
  std::
  vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::~vector(&local_d0);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_e8);
  if ((long *)local_108._M_allocated_capacity != local_f8) {
    operator_delete((void *)local_108._M_allocated_capacity,local_f8[0] + 1);
  }
  node_00 = local_90;
  pcVar2 = local_118 + 0x10;
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  if (local_68 != local_58) {
    operator_delete(local_68,local_58[0] + 1);
  }
  pMVar5 = local_b8;
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"EmissiveFactor","");
  local_b0._M_dataplus._M_p = (pointer)0x0;
  dVar3 = getProperty<double>(node_00,(string *)local_118,(double *)&local_b0);
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
  }
  pMVar5->emissiveFactor = dVar3;
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"AmbientColor","");
  local_b0._M_string_length = local_b0._M_string_length & 0xffffffff00000000;
  local_b0._M_dataplus._M_p = (pointer)0x0;
  VVar13 = getProperty(node_00,(string *)local_118,(Vector3 *)&local_b0);
  (pMVar5->ambientColor).x = (float)(int)VVar13._0_8_;
  (pMVar5->ambientColor).y = (float)(int)((ulong)VVar13._0_8_ >> 0x20);
  (pMVar5->ambientColor).z = VVar13.z;
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
  }
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"DiffuseColor","");
  local_b0._M_string_length = local_b0._M_string_length & 0xffffffff00000000;
  local_b0._M_dataplus._M_p = (pointer)0x0;
  VVar13 = getProperty(node_00,(string *)local_118,(Vector3 *)&local_b0);
  (pMVar5->diffuseColor).x = (float)(int)VVar13._0_8_;
  (pMVar5->diffuseColor).y = (float)(int)((ulong)VVar13._0_8_ >> 0x20);
  (pMVar5->diffuseColor).z = VVar13.z;
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
  }
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"TransparentColor","");
  local_b0._M_string_length = local_b0._M_string_length & 0xffffffff00000000;
  local_b0._M_dataplus._M_p = (pointer)0x0;
  VVar13 = getProperty(node_00,(string *)local_118,(Vector3 *)&local_b0);
  (pMVar5->transparentColor).x = (float)(int)VVar13._0_8_;
  (pMVar5->transparentColor).y = (float)(int)((ulong)VVar13._0_8_ >> 0x20);
  (pMVar5->transparentColor).z = VVar13.z;
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
  }
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"SpecularColor","");
  local_b0._M_string_length = local_b0._M_string_length & 0xffffffff00000000;
  local_b0._M_dataplus._M_p = (pointer)0x0;
  VVar13 = getProperty(node_00,(string *)local_118,(Vector3 *)&local_b0);
  (pMVar5->specularColor).x = (float)(int)VVar13._0_8_;
  (pMVar5->specularColor).y = (float)(int)((ulong)VVar13._0_8_ >> 0x20);
  (pMVar5->specularColor).z = VVar13.z;
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
  }
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"ShininessExponent","");
  local_b0._M_dataplus._M_p = (pointer)0x4000000000000000;
  dVar3 = getProperty<double>(node_00,(string *)local_118,(double *)&local_b0);
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
  }
  pMVar5->shininessExponent = dVar3;
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Emissive","");
  local_b0._M_string_length = local_b0._M_string_length & 0xffffffff00000000;
  local_b0._M_dataplus._M_p = (pointer)0x0;
  VVar13 = getProperty(node_00,(string *)local_118,(Vector3 *)&local_b0);
  (pMVar5->emissive).x = (float)(int)VVar13._0_8_;
  (pMVar5->emissive).y = (float)(int)((ulong)VVar13._0_8_ >> 0x20);
  (pMVar5->emissive).z = VVar13.z;
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
  }
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Ambient","");
  local_b0._M_string_length = local_b0._M_string_length & 0xffffffff00000000;
  local_b0._M_dataplus._M_p = (pointer)0x0;
  VVar13 = getProperty(node_00,(string *)local_118,(Vector3 *)&local_b0);
  (pMVar5->ambient).x = (float)(int)VVar13._0_8_;
  (pMVar5->ambient).y = (float)(int)((ulong)VVar13._0_8_ >> 0x20);
  (pMVar5->ambient).z = VVar13.z;
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
  }
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Diffuse","");
  local_b0._M_string_length = local_b0._M_string_length & 0xffffffff00000000;
  local_b0._M_dataplus._M_p = (pointer)0x0;
  VVar13 = getProperty(node_00,(string *)local_118,(Vector3 *)&local_b0);
  (pMVar5->diffuse).x = (float)(int)VVar13._0_8_;
  (pMVar5->diffuse).y = (float)(int)((ulong)VVar13._0_8_ >> 0x20);
  (pMVar5->diffuse).z = VVar13.z;
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
  }
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Specular","");
  local_b0._M_string_length = local_b0._M_string_length & 0xffffffff00000000;
  local_b0._M_dataplus._M_p = (pointer)0x0;
  VVar13 = getProperty(node_00,(string *)local_118,(Vector3 *)&local_b0);
  (pMVar5->specular).x = (float)(int)VVar13._0_8_;
  (pMVar5->specular).y = (float)(int)((ulong)VVar13._0_8_ >> 0x20);
  (pMVar5->specular).z = VVar13.z;
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
  }
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Shininess","");
  local_b0._M_dataplus._M_p = (pointer)0x4000000000000000;
  dVar3 = getProperty<double>(node_00,(string *)local_118,(double *)&local_b0);
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
  }
  pMVar5->shininess = dVar3;
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Opacity","");
  local_b0._M_dataplus._M_p = (pointer)0x3ff0000000000000;
  dVar3 = getProperty<double>(node_00,(string *)local_118,(double *)&local_b0);
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
  }
  pMVar5->opacity = dVar3;
  local_118._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_118,"Reflectivity","");
  local_b0._M_dataplus._M_p = (pointer)0x0;
  local_90 = (Node *)getProperty<double>(node_00,(string *)local_118,(double *)&local_b0);
  uVar11 = SUB84(local_90,0);
  uVar12 = (undefined4)((ulong)local_90 >> 0x20);
  if ((pointer)local_118._0_8_ != pcVar2) {
    operator_delete((void *)local_118._0_8_,local_108._M_allocated_capacity + 1);
    uVar11 = SUB84(local_90,0);
    uVar12 = (undefined4)((ulong)local_90 >> 0x20);
  }
  pMVar5->reflectivity = (double)CONCAT44(uVar12,uVar11);
  return;
}

Assistant:

explicit Material(const Node &node) :
                Object(std::get<int64_t>(node.properties[0])),
                shadingModel(getProperty<std::string>(node, "ShadingModel", "phong")),
                emissiveFactor(getProperty(node, "EmissiveFactor", 0.0)),
                ambientColor(getProperty(node, "AmbientColor", {})),
                diffuseColor(getProperty(node, "DiffuseColor", {})),
                transparentColor(getProperty(node, "TransparentColor", {})),
                specularColor(getProperty(node, "SpecularColor", {})),
                shininessExponent(getProperty(node, "ShininessExponent", 2.0)),
                emissive(getProperty(node, "Emissive", {})),
                ambient(getProperty(node, "Ambient", {})),
                diffuse(getProperty(node, "Diffuse", {})),
                specular(getProperty(node, "Specular", {})),
                shininess(getProperty(node, "Shininess", 2.0)),
                opacity(getProperty(node, "Opacity", 1.0)),
                reflectivity(getProperty(node, "Reflectivity", 0.0)) {}